

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O3

bool __thiscall jbcoin::STObject::clearFlag(STObject *this,uint32_t f)

{
  STBase *pSVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  iVar2 = getFieldIndex(this,(SField *)sfFlags);
  if ((iVar2 == -1) ||
     (pSVar1 = (this->v_).
               super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar2].p_, pSVar1 == (STBase *)0x0)) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    lVar3 = __dynamic_cast(pSVar1,&STBase::typeinfo,&STInteger<unsigned_int>::typeinfo,0);
    if (lVar3 != 0) {
      *(uint *)(lVar3 + 0x10) = *(uint *)(lVar3 + 0x10) & ~f;
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool STObject::clearFlag (std::uint32_t f)
{
    STUInt32* t = dynamic_cast<STUInt32*> (getPField (sfFlags));

    if (!t)
        return false;

    t->setValue (t->value () & ~f);
    return true;
}